

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile_example.c
# Opt level: O0

void print_size(FILE *_fp,opus_int64 _nbytes,int _metric,char *_spacer)

{
  int iVar1;
  long lVar2;
  int local_48;
  int shift;
  int base;
  opus_int64 round;
  opus_int64 den;
  opus_int64 val;
  char *_spacer_local;
  int _metric_local;
  opus_int64 _nbytes_local;
  FILE *_fp_local;
  
  iVar1 = 0x400;
  if (_metric != 0) {
    iVar1 = 1000;
  }
  round = 1;
  local_48 = 0;
  _shift = 0;
  while ((local_48 < 6 && (round * iVar1 - _shift <= _nbytes))) {
    round = iVar1 * round;
    local_48 = local_48 + 1;
    _shift = round >> 1;
  }
  lVar2 = (_nbytes + _shift) / round;
  if ((round < 2) || (9 < lVar2)) {
    if ((round < 2) || (99 < lVar2)) {
      fprintf((FILE *)_fp,"%li%s%c",lVar2,_spacer,(ulong)(uint)(int)" kMGTPE"[local_48]);
    }
    else {
      if (round < 1000000000) {
        den = (_nbytes * 10 + _shift) / round;
      }
      else {
        den = (_nbytes + _shift / 10) / (round / 10);
      }
      fprintf((FILE *)_fp,"%li.%i%s%c",den / 10,den % 10 & 0xffffffff,_spacer,
              (ulong)(uint)(int)" kMGTPE"[local_48]);
    }
  }
  else {
    if (round < 1000000000) {
      den = (_nbytes * 100 + _shift) / round;
    }
    else {
      den = (_nbytes + _shift / 100) / (round / 100);
    }
    fprintf((FILE *)_fp,"%li.%02i%s%c",den / 100,den % 100 & 0xffffffff,_spacer,
            (ulong)(uint)(int)" kMGTPE"[local_48]);
  }
  return;
}

Assistant:

static void print_size(FILE *_fp,opus_int64 _nbytes,int _metric,
 const char *_spacer){
  static const char SUFFIXES[7]={' ','k','M','G','T','P','E'};
  opus_int64 val;
  opus_int64 den;
  opus_int64 round;
  int        base;
  int        shift;
  base=_metric?1000:1024;
  round=0;
  den=1;
  for(shift=0;shift<6;shift++){
    if(_nbytes<den*base-round)break;
    den*=base;
    round=den>>1;
  }
  val=(_nbytes+round)/den;
  if(den>1&&val<10){
    if(den>=1000000000)val=(_nbytes+(round/100))/(den/100);
    else val=(_nbytes*100+round)/den;
    fprintf(_fp,"%li.%02i%s%c",(long)(val/100),(int)(val%100),
     _spacer,SUFFIXES[shift]);
  }
  else if(den>1&&val<100){
    if(den>=1000000000)val=(_nbytes+(round/10))/(den/10);
    else val=(_nbytes*10+round)/den;
    fprintf(_fp,"%li.%i%s%c",(long)(val/10),(int)(val%10),
     _spacer,SUFFIXES[shift]);
  }
  else fprintf(_fp,"%li%s%c",(long)val,_spacer,SUFFIXES[shift]);
}